

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void Engine::retrieve_assumption_nogood(vec<BoolView> *xs)

{
  Lit p_00;
  vec<Lit> *pvVar1;
  int ii;
  uint uVar2;
  ulong uVar3;
  Clause *pCVar4;
  Lit *pLVar5;
  uint ii_1;
  int iVar6;
  uint jj;
  anon_union_8_2_743a5d44_for_Reason_0 aVar7;
  uint uVar8;
  vec<Lit> *this;
  Lit p;
  Lit p_1;
  Lit local_7c;
  undefined1 local_78 [8];
  Lit *pLStack_70;
  vec<Lit> local_68;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  Lit local_44;
  ulong local_40;
  vec<BoolView> *local_38;
  
  local_68.sz = 0;
  local_68.cap = 0;
  local_68.data = (Lit *)0x0;
  uVar8 = sat.trail.sz - 1;
  uVar2 = engine.assumptions.data[uVar8];
  uVar3 = 0;
  local_40 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    local_40 = uVar3;
  }
  for (; local_40 != uVar3; uVar3 = uVar3 + 1) {
    sat.seen.data[(uint)(engine.assumptions.data[uVar3] >> 1)] = '\x02';
  }
  local_78 = (undefined1  [8])(CONCAT44(local_78._4_4_,uVar2) ^ 1);
  local_44.x = uVar2;
  local_38 = xs;
  vec<Lit>::push(&local_68,(Lit *)local_78);
  local_78 = (undefined1  [8])0x0;
  pLStack_70 = (Lit *)0x0;
  if (-1 < sat.trailpos.data[(uint)((int)uVar2 >> 1)]) {
    pCVar4 = SAT::getExpl(&sat,(Lit)(uVar2 ^ 1));
    if (pCVar4 == (Clause *)0x0) {
      vec<Lit>::push(&local_68,&local_44);
    }
    else {
      iVar6 = 0;
      for (uVar8 = 1; uVar8 < *(uint *)pCVar4 >> 8; uVar8 = uVar8 + 1) {
        pLVar5 = Clause::operator[](pCVar4,uVar8);
        p_1.x = pLVar5->x;
        sat.seen.data[(uint)(p_1.x >> 1)] = sat.seen.data[(uint)(p_1.x >> 1)] | 1;
        if (sat.trailpos.data[(uint)(p_1.x >> 1)] < 0) {
          vec<Lit>::push((vec<Lit> *)local_78,&p_1);
        }
        else {
          iVar6 = iVar6 + 1;
        }
      }
      if (iVar6 != 0) {
        aVar7 = (anon_union_8_2_743a5d44_for_Reason_0)
                sat.reason.data[(uint)((int)uVar2 >> 1)].field_0._pt;
        uVar3 = (ulong)(sat.trail.sz - 1);
        while (pvVar1 = sat.trail.data, 0 < (int)uVar3) {
          sat.index = sat.trail.data[uVar3].sz;
          while (uVar2 = sat.index - 1, uVar2 != 0xffffffff) {
            p_00.x = pvVar1[uVar3].data[uVar2].x;
            sat.index = uVar2;
            if ((sat.seen.data[(uint)(p_00.x >> 1)] & 1U) != 0) {
              iVar6 = iVar6 + -1;
              p_1.x = p_00.x;
              if ((sat.seen.data[(uint)(p_00.x >> 1)] & 2U) == 0) {
                vec<Lit>::push((vec<Lit> *)local_78,&p_1);
                local_50 = (anon_union_8_2_743a5d44_for_Reason_0)
                           sat.reason.data[(uint)(p_1.x >> 1)].field_0._pt;
                if (aVar7._pt != local_50._pt) {
                  pCVar4 = SAT::getExpl(&sat,p_1);
                  for (uVar2 = 1; aVar7 = local_50, uVar2 < *(uint *)pCVar4 >> 8; uVar2 = uVar2 + 1)
                  {
                    pLVar5 = Clause::operator[](pCVar4,uVar2);
                    local_7c.x = pLVar5->x;
                    uVar8 = local_7c.x >> 1;
                    if ((sat.seen.data[uVar8] & 1U) == 0) {
                      sat.seen.data[uVar8] = sat.seen.data[uVar8] | 1;
                      if (sat.trailpos.data[uVar8] < 0) {
                        vec<Lit>::push((vec<Lit> *)local_78,&local_7c);
                      }
                      else {
                        iVar6 = iVar6 + 1;
                      }
                    }
                  }
                }
              }
              else {
                pCVar4 = SAT::getExpl(&sat,p_00);
                if (pCVar4 == (Clause *)0x0) {
                  local_7c.x = p_1.x ^ 1;
                  vec<Lit>::push(&local_68,&local_7c);
                }
                else {
                  uVar2 = 1;
                  local_50 = aVar7;
                  do {
                    if (*(uint *)pCVar4 >> 8 <= uVar2) {
                      this = (vec<Lit> *)local_78;
                      pLVar5 = &p_1;
                      goto LAB_00194206;
                    }
                    pLVar5 = Clause::operator[](pCVar4,uVar2);
                    uVar2 = uVar2 + 1;
                  } while ((sat.seen.data[(uint)(pLVar5->x >> 1)] & 1U) != 0);
                  local_7c.x = p_1.x ^ 1;
                  this = &local_68;
                  pLVar5 = &local_7c;
LAB_00194206:
                  vec<Lit>::push(this,pLVar5);
                  aVar7 = local_50;
                }
                if (iVar6 == 0) goto LAB_00194233;
              }
            }
          }
          uVar3 = uVar3 - 1;
          SAT::btToLevel(&sat,(int)uVar3);
        }
LAB_00194233:
        for (uVar3 = 0; uVar3 < ((ulong)local_78 & 0xffffffff); uVar3 = uVar3 + 1) {
          sat.seen.data[(uint)(pLStack_70[uVar3].x >> 1)] =
               sat.seen.data[(uint)(pLStack_70[uVar3].x >> 1)] & 0xfe;
        }
        for (uVar3 = 0; uVar3 < (local_68._0_8_ & 0xffffffff); uVar3 = uVar3 + 1) {
          sat.seen.data[(uint)(local_68.data[uVar3].x >> 1)] =
               sat.seen.data[(uint)(local_68.data[uVar3].x >> 1)] & 0xfe;
        }
      }
    }
  }
  free(pLStack_70);
  for (uVar3 = 0; uVar3 < (local_68._0_8_ & 0xffffffff); uVar3 = uVar3 + 1) {
    local_78 = (undefined1  [8])&PTR_finished_001efbb8;
    pLStack_70 = (Lit *)(CONCAT35(pLStack_70._5_3_,
                                  CONCAT14((char)local_68.data[uVar3].x,local_68.data[uVar3].x >> 1)
                                 ) & 0xffffff01ffffffff);
    vec<BoolView>::push(local_38,(BoolView *)local_78);
  }
  for (uVar3 = 0; local_40 != uVar3; uVar3 = uVar3 + 1) {
    sat.seen.data[(uint)(engine.assumptions.data[uVar3] >> 1)] = '\x02';
  }
  free(local_68.data);
  return;
}

Assistant:

void Engine::retrieve_assumption_nogood(vec<BoolView>& xs) {
	vec<Lit> out_nogood;
	const int assump_sz = sat.decisionLevel();
	assert(assump_sz < static_cast<int>(engine.assumptions.size()));

	const Lit q(toLit(engine.assumptions[assump_sz]));
	assert(sat.value(q) == l_False);

	// Mark the available assumptions
	for (int ii = 0; ii < assump_sz; ii++) {
		assert(sat.value(toLit(engine.assumptions[ii])) == l_True);
		sat.seen[engine.assumptions[ii] >> 1] = 2;
	}

	// Collect the nogood.
	// pushback_reason([](Lit p) { return sat.seen[var(p)]&2; }, q, out_nogood);
	pushback_reason_lazy([](Lit p) { return sat.seen[var(p)] & 2; }, q, out_nogood);

	for (unsigned int ii = 0; ii < out_nogood.size(); ii++) {
		xs.push(out_nogood[ii]);
	}

	// Finally, clear the marked assumptions
	for (int ii = 0; ii < assump_sz; ii++) {
		sat.seen[engine.assumptions[ii] >> 1] = 2;
	}
}